

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::Unser<DataStream,std::vector<uint256,std::allocator<uint256>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<uint256,_std::allocator<uint256>_> *v)

{
  pointer *ppuVar1;
  long lVar2;
  pointer puVar3;
  iterator __position;
  base_blob<256U> *pbVar4;
  uint64_t uVar5;
  size_t in_RCX;
  uint64_t __n;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = (v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.super__Vector_impl_data.
      _M_finish != puVar3) {
    (v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.super__Vector_impl_data.
    _M_finish = puVar3;
  }
  uVar5 = ReadCompactSize<DataStream>(s,true);
  if (uVar5 != 0) {
    __n = 0;
    do {
      uVar6 = __n + 0x2625a;
      __n = uVar5;
      if (uVar6 < uVar5) {
        __n = uVar6;
      }
      std::vector<uint256,_std::allocator<uint256>_>::reserve(v,__n);
      while (__position._M_current =
                  (v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                  super__Vector_impl_data._M_finish,
            (ulong)((long)__position._M_current -
                    (long)(v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 5) < __n) {
        if (__position._M_current ==
            (v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<>(v,__position);
        }
        else {
          pbVar4 = &(__position._M_current)->super_base_blob<256U>;
          (pbVar4->m_data)._M_elems[0x10] = '\0';
          (pbVar4->m_data)._M_elems[0x11] = '\0';
          (pbVar4->m_data)._M_elems[0x12] = '\0';
          (pbVar4->m_data)._M_elems[0x13] = '\0';
          (pbVar4->m_data)._M_elems[0x14] = '\0';
          (pbVar4->m_data)._M_elems[0x15] = '\0';
          (pbVar4->m_data)._M_elems[0x16] = '\0';
          (pbVar4->m_data)._M_elems[0x17] = '\0';
          pbVar4 = &(__position._M_current)->super_base_blob<256U>;
          (pbVar4->m_data)._M_elems[0x18] = '\0';
          (pbVar4->m_data)._M_elems[0x19] = '\0';
          (pbVar4->m_data)._M_elems[0x1a] = '\0';
          (pbVar4->m_data)._M_elems[0x1b] = '\0';
          (pbVar4->m_data)._M_elems[0x1c] = '\0';
          (pbVar4->m_data)._M_elems[0x1d] = '\0';
          (pbVar4->m_data)._M_elems[0x1e] = '\0';
          (pbVar4->m_data)._M_elems[0x1f] = '\0';
          ((__position._M_current)->super_base_blob<256U>).m_data._M_elems[0] = '\0';
          ((__position._M_current)->super_base_blob<256U>).m_data._M_elems[1] = '\0';
          ((__position._M_current)->super_base_blob<256U>).m_data._M_elems[2] = '\0';
          ((__position._M_current)->super_base_blob<256U>).m_data._M_elems[3] = '\0';
          ((__position._M_current)->super_base_blob<256U>).m_data._M_elems[4] = '\0';
          ((__position._M_current)->super_base_blob<256U>).m_data._M_elems[5] = '\0';
          ((__position._M_current)->super_base_blob<256U>).m_data._M_elems[6] = '\0';
          ((__position._M_current)->super_base_blob<256U>).m_data._M_elems[7] = '\0';
          pbVar4 = &(__position._M_current)->super_base_blob<256U>;
          (pbVar4->m_data)._M_elems[8] = '\0';
          (pbVar4->m_data)._M_elems[9] = '\0';
          (pbVar4->m_data)._M_elems[10] = '\0';
          (pbVar4->m_data)._M_elems[0xb] = '\0';
          (pbVar4->m_data)._M_elems[0xc] = '\0';
          (pbVar4->m_data)._M_elems[0xd] = '\0';
          (pbVar4->m_data)._M_elems[0xe] = '\0';
          (pbVar4->m_data)._M_elems[0xf] = '\0';
          ppuVar1 = &(v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        DataStream::read(s,(int)(v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                                super__Vector_impl_data._M_finish + -0x20,(void *)0x20,in_RCX);
      }
    } while (uVar6 < uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }